

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress.c
# Opt level: O0

int enet_host_compress_with_range_coder(ENetHost *host)

{
  ENetHost *host_00;
  ENetCompressor compressor;
  ENetCompressor *in_stack_ffffffffffffffc8;
  int local_4;
  
  memset(&stack0xffffffffffffffd0,0,0x20);
  host_00 = (ENetHost *)enet_range_coder_create();
  if (host_00 == (ENetHost *)0x0) {
    local_4 = -1;
  }
  else {
    enet_host_compress(host_00,in_stack_ffffffffffffffc8);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int
enet_host_compress_with_range_coder (ENetHost * host)
{
    ENetCompressor compressor;
    memset (& compressor, 0, sizeof (compressor));
    compressor.context = enet_range_coder_create();
    if (compressor.context == NULL)
      return -1;
    compressor.compress = enet_range_coder_compress;
    compressor.decompress = enet_range_coder_decompress;
    compressor.destroy = enet_range_coder_destroy;
    enet_host_compress (host, & compressor);
    return 0;
}